

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  expkind eVar1;
  OpCode o;
  int iVar2;
  int e_1;
  OpCode op;
  int e;
  expdesc *ex_local;
  expdesc *var_local;
  FuncState *fs_local;
  
  eVar1 = var->k;
  if (eVar1 == VLOCAL) {
    freeexp(fs,ex);
    exp2reg(fs,ex,(var->u).info);
  }
  else {
    if (eVar1 == VUPVAL) {
      iVar2 = luaK_exp2anyreg(fs,ex);
      luaK_codeABC(fs,OP_SETUPVAL,iVar2,(var->u).info,0);
    }
    else if (eVar1 == VINDEXED) {
      o = OP_SETTABUP;
      if ((var->u).ind.vt == '\b') {
        o = OP_SETTABLE;
      }
      iVar2 = luaK_exp2RK(fs,ex);
      luaK_codeABC(fs,o,(uint)(var->u).ind.t,(int)(var->u).ind.idx,iVar2);
    }
    freeexp(fs,ex);
  }
  return;
}

Assistant:

void luaK_storevar (FuncState *fs, expdesc *var, expdesc *ex) {
  switch (var->k) {
    case VLOCAL: {
      freeexp(fs, ex);
      exp2reg(fs, ex, var->u.info);  /* compute 'ex' into proper place */
      return;
    }
    case VUPVAL: {
      int e = luaK_exp2anyreg(fs, ex);
      luaK_codeABC(fs, OP_SETUPVAL, e, var->u.info, 0);
      break;
    }
    case VINDEXED: {
      OpCode op = (var->u.ind.vt == VLOCAL) ? OP_SETTABLE : OP_SETTABUP;
      int e = luaK_exp2RK(fs, ex);
      luaK_codeABC(fs, op, var->u.ind.t, var->u.ind.idx, e);
      break;
    }
    default: lua_assert(0);  /* invalid var kind to store */
  }
  freeexp(fs, ex);
}